

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *line,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
          basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
          CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 compress_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_44;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  compress_00 = SUB81(sectionStartCharacters,0);
  local_40 = delimiterCharacters;
  local_38 = sectionStartCharacters;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     delimiterCharacters->_M_str,0,delimiterCharacters->_M_len);
  if (sVar2 == 0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (__return_storage_ptr__,this,line,
               (basic_string_view<char,_std::char_traits<char>_> *)((ulong)sectionMatch & 0xff),
               (bool)compress_00);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_44 = (int)sectionMatch;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str,0,
                       line->_M_len);
    if (sVar3 == 0xffffffffffffffff) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)this);
    }
    else {
      uVar6 = *(ulong *)this;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          if (sVar3 < sVar2) {
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(sVar3 - uVar7);
            if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
              if ((byte)local_44 == '\0') {
                local_68._M_string_length = 0;
                local_68.field_2._M_local_buf[0] = '\0';
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,&local_68);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                           local_68.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            else {
              if (uVar6 < uVar7) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar7);
              }
              local_68._M_dataplus._M_p = (pointer)paVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(uVar6 - uVar7) < paVar4) {
                local_68._M_dataplus._M_p = (pointer)(uVar6 - uVar7);
              }
              local_68._M_string_length = uVar7 + *(long *)(this + 8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_68);
            }
            uVar6 = sVar3 + 1;
            sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str
                               ,uVar6,line->_M_len);
          }
          else {
            sVar5 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                              (sVar2 + 1,(basic_string_view<char,_std::char_traits<char>_> *)this,
                               *(byte *)(*(long *)(this + 8) + sVar2),
                               *(char *)((long)&local_38->_M_len +
                                        (ulong)*(byte *)(*(long *)(this + 8) + sVar2)));
            if (sVar5 == 0xffffffffffffffff) {
              if (*(ulong *)this < uVar7) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar7);
              }
              local_68._M_string_length = uVar7 + *(long *)(this + 8);
              local_68._M_dataplus._M_p = (pointer)(*(ulong *)this - uVar7);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_68);
              uVar6 = *(ulong *)this;
            }
            else {
              sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 line->_M_str,sVar5 + 1,line->_M_len);
              if (sVar2 == 0xffffffffffffffff) {
                if (*(ulong *)this < uVar7) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",uVar7);
                }
                local_68._M_string_length = uVar7 + *(long *)(this + 8);
                local_68._M_dataplus._M_p = (pointer)(*(ulong *)this - uVar7);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_68);
                uVar6 = 0xffffffffffffffff;
                sVar2 = 0xffffffffffffffff;
              }
              else {
                paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(*(ulong *)this - uVar7);
                if (*(ulong *)this < uVar7) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",uVar7);
                }
                local_68._M_dataplus._M_p = (pointer)(sVar2 - uVar7);
                if (paVar4 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(sVar2 - uVar7)) {
                  local_68._M_dataplus._M_p = (pointer)paVar4;
                }
                local_68._M_string_length = uVar7 + *(long *)(this + 8);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_68);
                uVar6 = sVar2 + 1;
                sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                   local_40->_M_str,uVar6,local_40->_M_len);
              }
              sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 line->_M_str,uVar6,line->_M_len);
            }
          }
          uVar7 = uVar6;
          if ((uVar6 != 0xffffffffffffffff) && (sVar3 == 0xffffffffffffffff)) {
            uVar1 = *(ulong *)this;
            uVar7 = 0xffffffffffffffff;
            if (((byte)local_44 & uVar1 <= uVar6) == 0) {
              if (uVar1 < uVar6) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar6);
              }
              local_68._M_string_length = uVar6 + *(long *)(this + 8);
              local_68._M_dataplus._M_p = (pointer)(uVar1 - uVar6);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_68);
            }
          }
          uVar6 = *(ulong *)this;
        } while (uVar7 < uVar6);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}